

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O3

void __thiscall QFileSystemEntry::findFileNameSeparators(QFileSystemEntry *this)

{
  char16_t cVar1;
  char16_t *pcVar2;
  uint uVar9;
  short sVar3;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar4;
  
  if (this->m_firstDotInFileName != -2) {
    return;
  }
  resolveFilePath(this);
  uVar9._0_2_ = this->m_lastSeparator;
  uVar9._2_2_ = this->m_firstDotInFileName;
  sVar3 = -1;
  if (-1 < (short)(undefined2)uVar9) {
    sVar3 = (undefined2)uVar9;
  }
  uVar4 = (uint)sVar3;
  uVar8 = 0;
  if (0 < (short)(undefined2)uVar9) {
    uVar8 = uVar9;
  }
  uVar8 = uVar8 & 0xffff;
  uVar9 = (uint)(this->m_filePath).d.size;
  pcVar2 = (this->m_filePath).d.ptr;
  uVar5 = uVar9 - 1;
  if ((int)(uVar8 - 1) < (int)(uVar9 - 1)) {
    uVar5 = uVar8 - 1;
  }
  do {
    uVar12 = uVar9 - 1;
    uVar10 = (ulong)uVar12;
    if ((int)uVar12 < (int)uVar8) {
      uVar7 = 0xffffffff;
      uVar12 = uVar5;
LAB_0011989b:
      iVar6 = (int)uVar7;
      uVar5 = uVar4;
      iVar11 = iVar6;
      if ((int)(uVar9 - 2) < (int)uVar8 || uVar12 == uVar4) goto LAB_001198e1;
      uVar13 = (ulong)(uVar9 - 2);
      goto LAB_001198bd;
    }
    cVar1 = pcVar2[uVar12];
    uVar7 = uVar10;
    if (cVar1 == L'.') goto LAB_0011989b;
    uVar9 = uVar12;
  } while (cVar1 != L'/');
  this->m_lastSeparator = (qint16)uVar12;
  this->m_firstDotInFileName = -1;
  goto LAB_0011990f;
LAB_001198bd:
  do {
    iVar11 = (int)uVar7;
    cVar1 = pcVar2[uVar13];
    if (cVar1 == L'.') {
      uVar7 = uVar13 & 0xffffffff;
    }
    else {
      uVar5 = (uint)uVar13;
      if (cVar1 == L'/') break;
    }
    iVar11 = (int)uVar7;
    uVar13 = uVar13 - 1;
    uVar9 = (int)uVar10 - 1;
    uVar10 = (ulong)uVar9;
    uVar5 = uVar4;
  } while ((int)uVar8 < (int)uVar9);
LAB_001198e1:
  this->m_lastSeparator = (qint16)uVar5;
  uVar9 = 0;
  if (0 < (int)uVar5) {
    uVar9 = uVar5;
  }
  sVar3 = -1;
  if (iVar11 != -1) {
    sVar3 = (short)iVar11 - (short)uVar9;
  }
  this->m_firstDotInFileName = sVar3;
  if (iVar6 != -1) {
    iVar6 = iVar6 - iVar11;
    if (iVar6 == 0) {
      iVar6 = 0;
    }
    goto LAB_00119913;
  }
LAB_0011990f:
  iVar6 = 0xffff;
LAB_00119913:
  this->m_lastDotInFileName = (qint16)iVar6;
  return;
}

Assistant:

void QFileSystemEntry::findFileNameSeparators() const
{
    if (m_firstDotInFileName == Uninitialized) {
        resolveFilePath();
        int firstDotInFileName = -1;
        int lastDotInFileName = -1;
        int lastSeparator = m_lastSeparator;

        int stop;
        if (lastSeparator < 0) {
            lastSeparator = -1;
            stop = 0;
        } else {
            stop = lastSeparator;
        }

        int i = m_filePath.size() - 1;
        for (; i >= stop; --i) {
            if (m_filePath.at(i).unicode() == '.') {
                firstDotInFileName = lastDotInFileName = i;
                break;
            } else if (m_filePath.at(i).unicode() == '/') {
                lastSeparator = i;
                break;
            }
        }

        if (lastSeparator != i) {
            for (--i; i >= stop; --i) {
                if (m_filePath.at(i).unicode() == '.')
                    firstDotInFileName = i;
                else if (m_filePath.at(i).unicode() == '/') {
                    lastSeparator = i;
                    break;
                }
            }
        }
        m_lastSeparator = lastSeparator;
        m_firstDotInFileName = firstDotInFileName == -1 ? -1 : firstDotInFileName - qMax(0, lastSeparator);
        if (lastDotInFileName == -1)
            m_lastDotInFileName = -1;
        else if (firstDotInFileName == lastDotInFileName)
            m_lastDotInFileName = 0;
        else
            m_lastDotInFileName = lastDotInFileName - firstDotInFileName;
    }
}